

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::readPacket(MatroskaDemuxer *this,AVPacket *avPacket)

{
  uint8_t *puVar1;
  int iVar2;
  AVPacket *this_00;
  int local_34;
  AVPacket *pAStack_30;
  int res;
  AVPacket *newPacket;
  AVPacket *pAStack_20;
  uint32_t id;
  AVPacket *avPacket_local;
  MatroskaDemuxer *this_local;
  
  pAStack_20 = avPacket;
  avPacket_local = (AVPacket *)this;
  if (this->m_lastDeliveryPacket != (AVPacket *)0x0) {
    puVar1 = this->m_lastDeliveryPacket->data;
    if (puVar1 != (uint8_t *)0x0) {
      operator_delete__(puVar1);
    }
    if (this->m_lastDeliveryPacket != (AVPacket *)0x0) {
      operator_delete(this->m_lastDeliveryPacket,0x50);
    }
    this->m_lastDeliveryPacket = (AVPacket *)0x0;
  }
  pAStack_30 = (AVPacket *)0x0;
  do {
    iVar2 = matroska_deliver_packet(this,&stack0xffffffffffffffd0);
    if (iVar2 == 0) {
      if (pAStack_30 == (AVPacket *)0x0) {
        this_00 = (AVPacket *)operator_new(0x50);
        AVPacket::AVPacket(this_00);
        memcpy(pAStack_20,this_00,0x4c);
      }
      else {
        memcpy(pAStack_20,pAStack_30,0x50);
      }
      this->m_lastDeliveryPacket = pAStack_30;
      return 0;
    }
    if ((this->done & 1U) != 0) {
      return 1;
    }
    local_34 = 0;
    do {
      if (local_34 != 0) goto LAB_002c8994;
      newPacket._4_4_ = ebml_peek_id(this,&this->level_up);
      if (newPacket._4_4_ == 0) {
        return 1;
      }
      if (this->level_up != 0) {
        this->level_up = this->level_up + -1;
        goto LAB_002c8994;
      }
      if (newPacket._4_4_ == 0x1a45dfa3) {
        matroska_read_header(this);
      }
      else if (newPacket._4_4_ == 0x1f43b675) {
        local_34 = ebml_read_master(this,(uint32_t *)((long)&newPacket + 4));
        if ((-1 < local_34) && (local_34 = matroska_parse_cluster(this), local_34 == 0)) {
          local_34 = 1;
        }
      }
      else {
        local_34 = ebml_read_skip(this);
      }
    } while (this->level_up == 0);
    this->level_up = this->level_up + -1;
LAB_002c8994:
    if (local_34 == -1) {
      this->done = true;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::readPacket(AVPacket &avPacket)
{
    uint32_t id;
    if (m_lastDeliveryPacket)
    {
        delete[] m_lastDeliveryPacket->data;
        delete m_lastDeliveryPacket;
        m_lastDeliveryPacket = nullptr;
    }

    // Read stream until we have a packet queued.
    AVPacket *newPacket = nullptr;
    while (matroska_deliver_packet(newPacket) != 0)
    {
        // Have we already reached the end?
        if (done)
            return BufferedReader::DATA_EOF;

        int res = 0;
        while (res == 0)
        {
            if ((id = ebml_peek_id(&level_up)) == 0)
            {
                return BufferedReader::DATA_EOF;
            }
            if (level_up)
            {
                level_up--;
                break;
            }

            switch (id)
            {
            case MATROSKA_ID_CLUSTER:
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                if ((res = matroska_parse_cluster()) == 0)
                    res = 1;  // Parsed one cluster, let's get out.
                break;
            case EBML_ID_HEADER:
                matroska_read_header();
                break;
            default:
                res = ebml_read_skip();
            }

            if (level_up)
            {
                level_up--;
                break;
            }
        }

        if (res == -1)
            done = true;
    }
    if (newPacket)
    {
        memcpy(&avPacket, newPacket, sizeof(AVPacket));
    }
    else
        avPacket = *new AVPacket();
    m_lastDeliveryPacket = newPacket;
    return 0;
}